

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O3

int __thiscall QTextCursor::columnNumber(QTextCursor *this)

{
  QTextCursorPrivate *pQVar1;
  QTextDocumentPrivate *pQVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  QTextLayout *this_00;
  int iVar6;
  long in_FS_OFFSET;
  QTextLine QVar7;
  undefined1 *local_50;
  QTextEngine *local_48;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  iVar6 = 0;
  if ((pQVar1 != (QTextCursorPrivate *)0x0) &&
     (pQVar2 = pQVar1->priv, iVar6 = 0, pQVar2 != (QTextDocumentPrivate *)0x0)) {
    local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    iVar6 = 0;
    uVar4 = QFragmentMapData<QTextBlockData>::findNode(&(pQVar2->blocks).data,pQVar1->position,0);
    local_40._8_4_ = uVar4;
    local_40._0_8_ = pQVar2;
    bVar3 = QTextBlock::isValid((QTextBlock *)local_40);
    if (bVar3) {
      this_00 = QTextCursorPrivate::blockLayout((this->d).d.ptr,(QTextBlock *)local_40);
      iVar6 = ((this->d).d.ptr)->position;
      iVar5 = QTextBlock::position((QTextBlock *)local_40);
      iVar6 = iVar6 - iVar5;
      iVar5 = QTextLayout::lineCount(this_00);
      if (iVar5 != 0) {
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        QVar7 = QTextLayout::lineForTextPosition(this_00,iVar6);
        local_48 = QVar7.eng;
        local_50 = (undefined1 *)CONCAT44(local_50._4_4_,QVar7.index);
        if (local_48 == (QTextEngine *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar5 = QTextLine::textStart((QTextLine *)&local_50);
          iVar6 = iVar6 - iVar5;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

int QTextCursor::columnNumber() const
{
    if (!d || !d->priv)
        return 0;

    QTextBlock block = d->block();
    if (!block.isValid())
        return 0;

    const QTextLayout *layout = d->blockLayout(block);

    const int relativePos = d->position - block.position();

    if (layout->lineCount() == 0)
        return relativePos;

    QTextLine line = layout->lineForTextPosition(relativePos);
    if (!line.isValid())
        return 0;
    return relativePos - line.textStart();
}